

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcprepct.c
# Opt level: O0

void pre_process_context(j_compress_ptr cinfo,JSAMPARRAY input_buf,JDIMENSION *in_row_ctr,
                        JDIMENSION in_rows_avail,JSAMPIMAGE output_buf,JDIMENSION *out_row_group_ctr
                        ,JDIMENSION out_row_groups_avail)

{
  int iVar1;
  uint uVar2;
  uint in_ECX;
  uint *in_RDX;
  long in_RSI;
  long in_RDI;
  undefined8 in_R8;
  JSAMPARRAY in_R9;
  uint in_stack_00000008;
  int row;
  JDIMENSION inrows;
  int buf_height;
  int ci;
  int numrows;
  my_prep_ptr prep;
  int in_stack_ffffffffffffffa8;
  JDIMENSION in_stack_ffffffffffffffac;
  uint in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int local_40;
  long lVar3;
  undefined4 in_stack_ffffffffffffffe0;
  
  lVar3 = *(long *)(in_RDI + 0x200);
  iVar1 = *(int *)(in_RDI + 0x160) * 3;
  do {
    if (in_stack_00000008 <= *(uint *)in_R9) {
      return;
    }
    if (*in_RDX < in_ECX) {
      in_stack_ffffffffffffffb0 = in_ECX - *in_RDX;
      uVar2 = *(int *)(lVar3 + 0x6c) - *(int *)(lVar3 + 100);
      if (uVar2 < in_stack_ffffffffffffffb0) {
        in_stack_ffffffffffffffb0 = uVar2;
      }
      uVar2 = in_stack_ffffffffffffffb0;
      (**(code **)(*(long *)(in_RDI + 0x218) + 8))
                (in_RDI,in_RSI + (ulong)*in_RDX * 8,lVar3 + 0x10,*(undefined4 *)(lVar3 + 100),
                 in_stack_ffffffffffffffb0);
      if (*(int *)(lVar3 + 0x60) == *(int *)(in_RDI + 0x34)) {
        for (local_40 = 0; local_40 < *(int *)(in_RDI + 0x5c); local_40 = local_40 + 1) {
          for (in_stack_ffffffffffffffb4 = 1; in_stack_ffffffffffffffb4 <= *(int *)(in_RDI + 0x160);
              in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1) {
            jcopy_sample_rows((JSAMPARRAY)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                              (int)((ulong)in_R8 >> 0x20),in_R9,(int)((ulong)lVar3 >> 0x20),
                              (int)lVar3,uVar2);
          }
        }
      }
      *in_RDX = uVar2 + *in_RDX;
      *(uint *)(lVar3 + 100) = uVar2 + *(int *)(lVar3 + 100);
      *(uint *)(lVar3 + 0x60) = *(int *)(lVar3 + 0x60) - uVar2;
    }
    else {
      if (*(int *)(lVar3 + 0x60) != 0) {
        return;
      }
      if (*(int *)(lVar3 + 100) < *(int *)(lVar3 + 0x6c)) {
        for (local_40 = 0; local_40 < *(int *)(in_RDI + 0x5c); local_40 = local_40 + 1) {
          expand_bottom_edge((JSAMPARRAY)
                             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                             in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,0);
        }
        *(undefined4 *)(lVar3 + 100) = *(undefined4 *)(lVar3 + 0x6c);
      }
    }
    if (*(int *)(lVar3 + 100) == *(int *)(lVar3 + 0x6c)) {
      (**(code **)(*(long *)(in_RDI + 0x220) + 8))
                (in_RDI,lVar3 + 0x10,*(undefined4 *)(lVar3 + 0x68),in_R8,*(uint *)in_R9);
      *(uint *)in_R9 = *(uint *)in_R9 + 1;
      *(int *)(lVar3 + 0x68) = *(int *)(in_RDI + 0x160) + *(int *)(lVar3 + 0x68);
      if (iVar1 <= *(int *)(lVar3 + 0x68)) {
        *(undefined4 *)(lVar3 + 0x68) = 0;
      }
      if (iVar1 <= *(int *)(lVar3 + 100)) {
        *(undefined4 *)(lVar3 + 100) = 0;
      }
      *(int *)(lVar3 + 0x6c) = *(int *)(lVar3 + 100) + *(int *)(in_RDI + 0x160);
    }
  } while( true );
}

Assistant:

METHODDEF(void)
pre_process_context (j_compress_ptr cinfo,
		     JSAMPARRAY input_buf, JDIMENSION *in_row_ctr,
		     JDIMENSION in_rows_avail,
		     JSAMPIMAGE output_buf, JDIMENSION *out_row_group_ctr,
		     JDIMENSION out_row_groups_avail)
{
  my_prep_ptr prep = (my_prep_ptr) cinfo->prep;
  int numrows, ci;
  int buf_height = cinfo->max_v_samp_factor * 3;
  JDIMENSION inrows;

  while (*out_row_group_ctr < out_row_groups_avail) {
    if (*in_row_ctr < in_rows_avail) {
      /* Do color conversion to fill the conversion buffer. */
      inrows = in_rows_avail - *in_row_ctr;
      numrows = prep->next_buf_stop - prep->next_buf_row;
      numrows = (int) MIN((JDIMENSION) numrows, inrows);
      (*cinfo->cconvert->color_convert) (cinfo, input_buf + *in_row_ctr,
					 prep->color_buf,
					 (JDIMENSION) prep->next_buf_row,
					 numrows);
      /* Pad at top of image, if first time through */
      if (prep->rows_to_go == cinfo->image_height) {
	for (ci = 0; ci < cinfo->num_components; ci++) {
	  int row;
	  for (row = 1; row <= cinfo->max_v_samp_factor; row++) {
	    jcopy_sample_rows(prep->color_buf[ci], 0,
			      prep->color_buf[ci], -row,
			      1, cinfo->image_width);
	  }
	}
      }
      *in_row_ctr += numrows;
      prep->next_buf_row += numrows;
      prep->rows_to_go -= numrows;
    } else {
      /* Return for more data, unless we are at the bottom of the image. */
      if (prep->rows_to_go != 0)
	break;
      /* When at bottom of image, pad to fill the conversion buffer. */
      if (prep->next_buf_row < prep->next_buf_stop) {
	for (ci = 0; ci < cinfo->num_components; ci++) {
	  expand_bottom_edge(prep->color_buf[ci], cinfo->image_width,
			     prep->next_buf_row, prep->next_buf_stop);
	}
	prep->next_buf_row = prep->next_buf_stop;
      }
    }
    /* If we've gotten enough data, downsample a row group. */
    if (prep->next_buf_row == prep->next_buf_stop) {
      (*cinfo->downsample->downsample) (cinfo,
					prep->color_buf,
					(JDIMENSION) prep->this_row_group,
					output_buf, *out_row_group_ctr);
      (*out_row_group_ctr)++;
      /* Advance pointers with wraparound as necessary. */
      prep->this_row_group += cinfo->max_v_samp_factor;
      if (prep->this_row_group >= buf_height)
	prep->this_row_group = 0;
      if (prep->next_buf_row >= buf_height)
	prep->next_buf_row = 0;
      prep->next_buf_stop = prep->next_buf_row + cinfo->max_v_samp_factor;
    }
  }
}